

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *pFVar1;
  FILE *__stream;
  GLboolean GVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  GLContext ctx;
  GLContext local_48;
  
  GVar2 = ParseArgs(argc + -1,argv + 1);
  if (GVar2 == '\0') {
    local_48.ctx = (GLXContext)0x0;
    local_48.wnd = 0;
    local_48.dpy = (Display *)0x0;
    local_48.vi = (XVisualInfo *)0x0;
    local_48.cmap = 0;
    GVar2 = CreateContext(&local_48);
    if (GVar2 == '\0') {
      glewExperimental = 1;
      iVar3 = glewInit();
      __stream = _stdout;
      if (iVar3 == 0) {
        file = (FILE *)_stdout;
        uVar4 = glGetString(0x1f00);
        fprintf(__stream,"OpenGL vendor string: %s\n",uVar4);
        pFVar1 = file;
        uVar4 = glGetString(0x1f01);
        fprintf((FILE *)pFVar1,"OpenGL renderer string: %s\n",uVar4);
        pFVar1 = file;
        uVar4 = glGetString(0x1f02);
        fprintf((FILE *)pFVar1,"OpenGL version string: %s\n",uVar4);
        fwrite("OpenGL extensions (GL_): \n",0x1a,1,(FILE *)file);
        pcVar5 = (char *)glGetString(0x1f03);
        PrintExtensions(pcVar5);
        fwrite("GLX extensions (GLX_): \n",0x18,1,(FILE *)file);
        uVar4 = (*___glewXGetCurrentDisplay)();
        lVar6 = (*___glewXGetCurrentDisplay)();
        pcVar5 = (char *)glXQueryExtensionsString(uVar4,*(undefined4 *)(lVar6 + 0xe0));
        PrintExtensions(pcVar5);
        VisualInfo(&local_48);
        DestroyContext(&local_48);
        if ((FILE *)file == _stdout) {
          return 0;
        }
        fclose((FILE *)file);
        return 0;
      }
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int 
main (int argc, char** argv)
{
  GLenum err;
  GLContext ctx;

  /* ---------------------------------------------------------------------- */
  /* parse arguments */
  if (GL_TRUE == ParseArgs(argc-1, argv+1))
  {
#if defined(_WIN32)
    fprintf(stderr, "Usage: visualinfo [-a] [-s] [-h] [-pf <id>]\n");
    fprintf(stderr, "        -a: show all visuals\n");
    fprintf(stderr, "        -s: display to stdout instead of visualinfo.txt\n");
    fprintf(stderr, "        -pf <id>: use given pixelformat\n");
    fprintf(stderr, "        -h: this screen\n");
#else
    fprintf(stderr, "Usage: visualinfo [-h] [-display <display>] [-visual <id>]\n");
    fprintf(stderr, "        -h: this screen\n");
    fprintf(stderr, "        -display <display>: use given display\n");
    fprintf(stderr, "        -visual <id>: use given visual\n");
#endif
    return 1;
  }

  /* ---------------------------------------------------------------------- */
  /* create OpenGL rendering context */
  InitContext(&ctx);
  if (GL_TRUE == CreateContext(&ctx))
  {
    fprintf(stderr, "Error: CreateContext failed\n");
    DestroyContext(&ctx);
    return 1;
  }

  /* ---------------------------------------------------------------------- */
  /* initialize GLEW */
  glewExperimental = GL_TRUE;
#ifdef GLEW_MX
  err = glewContextInit(glewGetContext());
#  ifdef _WIN32
  err = err || wglewContextInit(wglewGetContext());
#  elif !defined(__APPLE__) && !defined(__HAIKU__) || defined(GLEW_APPLE_GLX)
  err = err || glxewContextInit(glxewGetContext());
#  endif
#else
  err = glewInit();
#endif
  if (GLEW_OK != err)
  {
    fprintf(stderr, "Error [main]: glewInit failed: %s\n", glewGetErrorString(err));
    DestroyContext(&ctx);
    return 1;
  }

  /* ---------------------------------------------------------------------- */
  /* open file */
#if defined(_WIN32)
  if (!displaystdout)
  {
#if defined(_MSC_VER) && (_MSC_VER >= 1400)
    if (fopen_s(&file, "visualinfo.txt", "w") != 0)
      file = stdout;
#else
    file = fopen("visualinfo.txt", "w");
#endif
  }
  if (file == NULL)
    file = stdout;
#else
  file = stdout;
#endif

  /* ---------------------------------------------------------------------- */
  /* output header information */
  /* OpenGL extensions */
  fprintf(file, "OpenGL vendor string: %s\n", glGetString(GL_VENDOR));
  fprintf(file, "OpenGL renderer string: %s\n", glGetString(GL_RENDERER));
  fprintf(file, "OpenGL version string: %s\n", glGetString(GL_VERSION));
  fprintf(file, "OpenGL extensions (GL_): \n");
  PrintExtensions((const char*)glGetString(GL_EXTENSIONS));

#ifndef GLEW_NO_GLU
  /* GLU extensions */
  fprintf(file, "GLU version string: %s\n", gluGetString(GLU_VERSION));
  fprintf(file, "GLU extensions (GLU_): \n");
  PrintExtensions((const char*)gluGetString(GLU_EXTENSIONS));
#endif

  /* ---------------------------------------------------------------------- */
  /* extensions string */
#if defined(GLEW_OSMESA)
#elif defined(GLEW_EGL)
#elif defined(_WIN32)
  /* WGL extensions */
  if (WGLEW_ARB_extensions_string || WGLEW_EXT_extensions_string)
  {
    fprintf(file, "WGL extensions (WGL_): \n");
    PrintExtensions(wglGetExtensionsStringARB ? 
                    (const char*)wglGetExtensionsStringARB(ctx.dc) :
		    (const char*)wglGetExtensionsStringEXT());
  }
#elif defined(__APPLE__) && !defined(GLEW_APPLE_GLX)
  
#elif defined(__HAIKU__)

  /* TODO */

#else
  /* GLX extensions */
  fprintf(file, "GLX extensions (GLX_): \n");
  PrintExtensions(glXQueryExtensionsString(glXGetCurrentDisplay(), 
                                           DefaultScreen(glXGetCurrentDisplay())));
#endif

  /* ---------------------------------------------------------------------- */
  /* enumerate all the formats */
  VisualInfo(&ctx);

  /* ---------------------------------------------------------------------- */
  /* release resources */
  DestroyContext(&ctx);
  if (file != stdout)
    fclose(file);
  return 0;
}